

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long in_RDI;
  U32 mls;
  size_t in_stack_000000c8;
  void *in_stack_000000d0;
  U32 *in_stack_000000d8;
  seqStore_t *in_stack_000000e0;
  ZSTD_matchState_t *in_stack_000000e8;
  size_t local_8;
  
  switch(*(undefined4 *)(in_RDI + 0x110)) {
  default:
    local_8 = ZSTD_compressBlock_doubleFast_noDict_4
                        (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,
                         in_stack_000000c8);
    break;
  case 5:
    local_8 = ZSTD_compressBlock_doubleFast_noDict_5
                        (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,
                         in_stack_000000c8);
    break;
  case 6:
    local_8 = ZSTD_compressBlock_doubleFast_noDict_6
                        (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,
                         in_stack_000000c8);
    break;
  case 7:
    local_8 = ZSTD_compressBlock_doubleFast_noDict_7
                        (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,
                         in_stack_000000c8);
  }
  return local_8;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_noDict_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_noDict_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_noDict_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_noDict_7(ms, seqStore, rep, src, srcSize);
    }
}